

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cpp
# Opt level: O0

bool vera::hasSmoothingGroup(shape_t *shape)

{
  size_type sVar1;
  const_reference pvVar2;
  ulong local_20;
  size_t i;
  shape_t *shape_local;
  
  local_20 = 0;
  while( true ) {
    sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (&(shape->mesh).smoothing_group_ids);
    if (sVar1 <= local_20) {
      return false;
    }
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&(shape->mesh).smoothing_group_ids,local_20);
    if (*pvVar2 != 0) break;
    local_20 = local_20 + 1;
  }
  return true;
}

Assistant:

bool hasSmoothingGroup(const tinyobj::shape_t& shape) {
    for (size_t i = 0; i < shape.mesh.smoothing_group_ids.size(); i++)
        if (shape.mesh.smoothing_group_ids[i] > 0)
            return true;
        
    return false;
}